

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flag_complex_edge_collapser.h
# Opt level: O1

void __thiscall
Gudhi::collapse::Flag_complex_edge_collapser<int,float>::
read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
          (Flag_complex_edge_collapser<int,float> *this,
          vector<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_> *r)

{
  pointer pvVar1;
  float fVar2;
  int iVar3;
  pointer ptVar4;
  ulong uVar5;
  pointer ppVar6;
  pointer ptVar7;
  float f;
  int u;
  int v;
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  neighbors_seq;
  ulong local_88;
  int local_80 [2];
  pointer local_78;
  pointer local_70;
  vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
  local_68 [12];
  undefined4 local_5c;
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  local_58;
  pointer local_40;
  Flag_complex_edge_collapser<int,float> local_38 [8];
  
  std::
  vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
  ::resize((vector<boost::container::flat_map<int,_float,_std::less<int>,_void>,_std::allocator<boost::container::flat_map<int,_float,_std::less<int>,_void>_>_>
            *)this,*(size_type *)(this + 0x18));
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::vector(&local_58,*(size_type *)(this + 0x18),(allocator_type *)local_80);
  ptVar7 = (r->
           super__Vector_base<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ptVar4 = (r->
           super__Vector_base<std::tuple<int,_int,_float>,_std::allocator<std::tuple<int,_int,_float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ptVar7 != ptVar4) {
    do {
      local_80[0] = (ptVar7->super__Tuple_impl<0UL,_int,_int,_float>).
                    super__Head_base<0UL,_int,_false>._M_head_impl;
      iVar3 = (ptVar7->super__Tuple_impl<0UL,_int,_int,_float>).super__Tuple_impl<1UL,_int,_float>.
              super__Head_base<1UL,_int,_false>._M_head_impl;
      local_70 = (pointer)CONCAT44(local_70._4_4_,iVar3);
      fVar2 = (ptVar7->super__Tuple_impl<0UL,_int,_int,_float>).super__Tuple_impl<1UL,_int,_float>.
              super__Tuple_impl<2UL,_float>.super__Head_base<2UL,_float,_false>._M_head_impl;
      local_88 = CONCAT44(local_88._4_4_,fVar2);
      pvVar1 = local_58.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_80[0];
      uVar5 = (pvVar1->m_holder).m_size;
      if (uVar5 < (pvVar1->m_holder).m_capacity) {
        ppVar6 = (pvVar1->m_holder).m_start;
        ppVar6[uVar5].first = iVar3;
        ppVar6[uVar5].second = fVar2;
        (pvVar1->m_holder).m_size = uVar5 + 1;
      }
      else {
        local_40 = (pvVar1->m_holder).m_start + uVar5;
        boost::container::
        vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
        priv_forward_range_insert_no_capacity<boost::container::dtl::insert_emplace_proxy<boost::container::new_allocator<std::pair<int,float>>,std::pair<int,float>*,int&,float&>>
                  ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                    *)local_38,pvVar1,&local_40,1,&local_88,&local_70);
        read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
                  (local_38);
      }
      pvVar1 = local_58.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (int)local_70;
      uVar5 = (pvVar1->m_holder).m_size;
      if (uVar5 < (pvVar1->m_holder).m_capacity) {
        ppVar6 = (pvVar1->m_holder).m_start;
        ppVar6[uVar5].first = local_80[0];
        ppVar6[uVar5].second = (float)local_88;
        (pvVar1->m_holder).m_size = uVar5 + 1;
      }
      else {
        local_78 = (pvVar1->m_holder).m_start + uVar5;
        boost::container::
        vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
        priv_forward_range_insert_no_capacity<boost::container::dtl::insert_emplace_proxy<boost::container::new_allocator<std::pair<int,float>>,std::pair<int,float>*,int&,float&>>
                  (local_68,pvVar1,&local_78,1,&local_88,local_80);
        read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
                  ((Flag_complex_edge_collapser<int,float> *)local_68);
      }
      ptVar7 = ptVar7 + 1;
    } while (ptVar7 != ptVar4);
  }
  local_88 = 0;
  if (local_58.
      super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_58.
      super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    do {
      pvVar1 = local_58.
               super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
               ._M_impl.super__Vector_impl_data._M_start + local_88;
      local_5c = 0xff800000;
      uVar5 = (pvVar1->m_holder).m_size;
      if (uVar5 < (pvVar1->m_holder).m_capacity) {
        ppVar6 = (pvVar1->m_holder).m_start;
        ppVar6[uVar5].first = (int)local_88;
        ppVar6[uVar5].second = -INFINITY;
        (pvVar1->m_holder).m_size = uVar5 + 1;
      }
      else {
        local_70 = (pvVar1->m_holder).m_start + uVar5;
        boost::container::
        vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>::
        priv_forward_range_insert_no_capacity<boost::container::dtl::insert_emplace_proxy<boost::container::new_allocator<std::pair<int,float>>,std::pair<int,float>*,unsigned_long&,float>>
                  ((vector<std::pair<int,float>,boost::container::new_allocator<std::pair<int,float>>,void>
                    *)local_80,pvVar1,&local_70,1,&local_5c,&local_88);
        read_edges<std::vector<std::tuple<int,int,float>,std::allocator<std::tuple<int,int,float>>>>
                  ((Flag_complex_edge_collapser<int,float> *)local_80);
      }
      boost::container::dtl::
      flat_tree_adopt_sequence_unique<boost::container::vector<boost::container::dtl::pair<int,float>,boost::container::new_allocator<boost::container::dtl::pair<int,float>>,void>,boost::container::dtl::flat_tree_value_compare<std::less<int>,boost::container::dtl::pair<int,float>,boost::container::dtl::select1st<int>>>
                (*(long *)this + local_88 * 0x18,
                 local_58.
                 super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_88);
      local_88 = local_88 + 1;
    } while (local_88 <
             (ulong)(((long)local_58.
                            super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_58.
                            super__Vector_base<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  std::
  vector<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>,_std::allocator<boost::container::vector<std::pair<int,_float>,_boost::container::new_allocator<std::pair<int,_float>_>,_void>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void read_edges(FilteredEdgeRange const&r){
    neighbors.resize(num_vertices);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
    init_neighbors_dense();
#endif
    // Use the raw sequence to avoid maintaining the order
    std::vector<typename Ngb_list::sequence_type> neighbors_seq(num_vertices);
    for(auto&&e : r){
      using std::get;
      Vertex u = get<0>(e);
      Vertex v = get<1>(e);
      Filtration_value f = get<2>(e);
      neighbors_seq[u].emplace_back(v, f);
      neighbors_seq[v].emplace_back(u, f);
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(u,v)=f;
      neighbors_dense(v,u)=f;
#endif
    }
    for(std::size_t i=0;i<neighbors_seq.size();++i){
      neighbors_seq[i].emplace_back(i, -std::numeric_limits<Filtration_value>::infinity());
      neighbors[i].adopt_sequence(std::move(neighbors_seq[i])); // calls sort
#ifdef GUDHI_COLLAPSE_USE_DENSE_ARRAY
      neighbors_dense(i,i)=-std::numeric_limits<Filtration_value>::infinity();
#endif
    }
  }